

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_statistics.cpp
# Opt level: O3

void __thiscall
duckdb::TableStatistics::CopyStats
          (TableStatistics *this,TableStatisticsLock *lock,TableStatistics *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar1;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var2;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer this_02;
  ReservoirSample *pRVar4;
  mutex *__tmp;
  pointer this_03;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> local_40;
  element_type *local_38;
  
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_019792c0;
  this_01[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[1]._M_use_count = 0;
  this_01[1]._M_weak_count = 0;
  this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[2]._M_use_count = 0;
  this_01[2]._M_weak_count = 0;
  this_01[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = 2;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  (other->stats_lock).internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this_01 + 1);
  this_00 = (other->stats_lock).internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (other->stats_lock).internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = this_01;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this_03 = (this->column_stats).
            super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
            .
            super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->column_stats).
           super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_03 != psVar1) {
    do {
      shared_ptr<duckdb::ColumnStatistics,_true>::operator->(this_03);
      ColumnStatistics::Copy((ColumnStatistics *)&stack0xffffffffffffffc0);
      ::std::
      vector<duckdb::shared_ptr<duckdb::ColumnStatistics,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>>
      ::emplace_back<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>
                ((vector<duckdb::shared_ptr<duckdb::ColumnStatistics,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>>
                  *)&other->column_stats,
                 (shared_ptr<duckdb::ColumnStatistics,_true> *)&stack0xffffffffffffffc0);
      if (local_38 != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      }
      this_03 = this_03 + 1;
    } while (this_03 != psVar1);
  }
  if ((this->table_sample).
      super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
      super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
      .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl != (BlockingSample *)0x0)
  {
    this_02 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
              ::operator->(&this->table_sample);
    pRVar4 = BlockingSample::Cast<duckdb::ReservoirSample>(this_02);
    (*(pRVar4->super_BlockingSample)._vptr_BlockingSample[3])
              ((_Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
                *)&stack0xffffffffffffffc0,pRVar4);
    _Var3._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (BlockingSample *)0x0;
    _Var2._M_head_impl =
         (other->table_sample).
         super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
         .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
    (other->table_sample).
    super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
    super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
    super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var2._M_head_impl != (BlockingSample *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_BlockingSample + 8))();
      if (local_40._M_head_impl != (BlockingSample *)0x0) {
        (**(code **)((long)(local_40._M_head_impl)->_vptr_BlockingSample + 8))();
      }
    }
  }
  return;
}

Assistant:

void TableStatistics::CopyStats(TableStatisticsLock &lock, TableStatistics &other) {
	D_ASSERT(other.Empty());
	other.stats_lock = make_shared_ptr<mutex>();
	for (auto &stats : column_stats) {
		other.column_stats.push_back(stats->Copy());
	}

	if (table_sample) {
		D_ASSERT(table_sample->type == SampleType::RESERVOIR_SAMPLE);
		auto &res = table_sample->Cast<ReservoirSample>();
		other.table_sample = res.Copy();
	}
}